

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerInlineeEnd(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  SymOpnd *dst;
  IntConstOpnd *src;
  Func *pFVar4;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar2 = Func::IsInlinee(instr->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3952,"(instr->m_func->IsInlinee())","instr->m_func->IsInlinee()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Func::IsTopFunc(this->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3953,"(m_func->IsTopFunc())","m_func->IsTopFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Func::GetHasImplicitCalls(instr->m_func);
  if (!bVar2) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,DeadStorePhase,sourceContextId,functionId)
    ;
    if (!bVar2) goto LAB_007b2e74;
  }
  dst = Func::GetInlineeArgCountSlotOpnd(instr->m_func);
  src = IR::IntConstOpnd::New(0,TyInt64,instr->m_func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,instr,true);
LAB_007b2e74:
  if (((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) == 0) &&
     ((pFVar4 = Func::GetParentFunc(instr->m_func), (*(uint *)&pFVar4->field_0x240 >> 1 & 1) == 0 ||
      ((*(uint *)&instr->m_func->field_0x240 >> 2 & 1) != 0)))) {
    IR::Instr::Remove(instr);
  }
  else {
    IR::Instr::FreeSrc1(instr);
  }
  return;
}

Assistant:

void
Lowerer::LowerInlineeEnd(IR::Instr *instr)
{
    Assert(instr->m_func->IsInlinee());
    Assert(m_func->IsTopFunc());

    // No need to emit code if the function wasn't marked as having implicit calls or bailout.  Dead-Store should have removed inline overhead.
    if (instr->m_func->GetHasImplicitCalls() || PHASE_OFF(Js::DeadStorePhase, this->m_func))
    {
        Lowerer::InsertMove(instr->m_func->GetInlineeArgCountSlotOpnd(),
                                IR::IntConstOpnd::New(0, TyMachReg, instr->m_func),
                                instr);
    }

    // Keep InlineeEnd around as it is used by register allocator, if we have optimized the arguments stack
    if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt && !instr->m_func->m_hasInlineOverheadRemoved))
    {
        instr->FreeSrc1();
    }
    else
    {
        instr->Remove();
    }
}